

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

bool __thiscall nuraft::inmem_log_store::compact(inmem_log_store *this,ulong last_log_index)

{
  bool bVar1;
  iterator this_00;
  __int_type _Var2;
  ulong in_RSI;
  iterator in_RDI;
  iterator entry;
  ulong ii;
  lock_guard<std::mutex> l;
  iterator in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffb0;
  _Self local_40 [3];
  _Self local_28;
  ulong local_20;
  ulong local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffa0,(mutex_type *)in_stack_ffffffffffffff98._M_node);
  for (local_20 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base<unsigned_long> *)in_RDI._M_node); local_20 <= local_10;
      local_20 = local_20 + 1) {
    this_00 = std::
              map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
              ::find(in_stack_ffffffffffffff98._M_node,(key_type *)0x19e32c);
    local_28._M_node = this_00._M_node;
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         ::end(in_stack_ffffffffffffff98._M_node);
    bVar1 = std::operator!=(&local_28,local_40);
    if (bVar1) {
      in_stack_ffffffffffffff98 =
           std::
           map<unsigned_long,std::shared_ptr<nuraft::log_entry>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>>
           ::erase_abi_cxx11_(this_00._M_node,in_RDI);
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff98;
    }
  }
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_RDI._M_node);
  if (_Var2 <= local_10) {
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffffb0._M_node,
               (__int_type)in_RDI._M_node);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19e3f8);
  return true;
}

Assistant:

bool inmem_log_store::compact(ulong last_log_index) {
    std::lock_guard<std::mutex> l(logs_lock_);
    for (ulong ii = start_idx_; ii <= last_log_index; ++ii) {
        auto entry = logs_.find(ii);
        if (entry != logs_.end()) {
            logs_.erase(entry);
        }
    }

    // WARNING:
    //   Even though nothing has been erased,
    //   we should set `start_idx_` to new index.
    if (start_idx_ <= last_log_index) {
        start_idx_ = last_log_index + 1;
    }
    return true;
}